

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> * __thiscall
cmDebugger_impl::GetBreakpoints
          (vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar1 == 0) {
    std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::vector
              (__return_storage_ptr__,&this->breakpoints);
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::vector<cmBreakpoint> GetBreakpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    return breakpoints;
  }